

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O2

void com_alf_lcu_row(com_core_t *core,int lcu_y)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  com_pic_t *pcVar7;
  com_seqh_t *pcVar8;
  s8 *psVar9;
  com_pic_header_t *pcVar10;
  u8 (*pauVar11) [3];
  uint uVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  ushort *puVar22;
  int iVar23;
  ushort *puVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  pel *ppVar30;
  long lVar31;
  byte *pbVar32;
  int (*paiVar33) [9];
  void *__src;
  pel *ppVar34;
  bool bVar35;
  byte *local_c0;
  pel *local_b8;
  
  pcVar7 = core->pic;
  pcVar8 = core->seqhdr;
  uVar2 = pcVar8->max_cuwh;
  lVar31 = (long)(int)uVar2;
  iVar16 = uVar2 * lcu_y;
  iVar3 = pcVar7->stride_luma;
  iVar4 = pcVar7->stride_chroma;
  iVar25 = pcVar8->pic_width_in_lcu * lcu_y;
  uVar20 = pcVar8->pic_height - iVar16;
  if ((int)uVar2 < (int)uVar20) {
    uVar20 = uVar2;
  }
  uVar12 = (uint)(0 < lcu_y);
  uVar27 = uVar12;
  if (((0 < lcu_y) && (pcVar8->cross_patch_loop_filter == '\0')) &&
     (psVar9 = (core->map).map_patch, uVar27 = 0,
     psVar9[iVar25] == psVar9[(long)iVar25 - (long)pcVar8->pic_width_in_lcu])) {
    uVar27 = uVar12;
  }
  pcVar10 = core->pichdr;
  iVar5 = pcVar8->bit_depth_internal;
  local_b8 = core->alf_src_buf[0] + 0x20;
  ppVar34 = core->alf_src_buf[1] + 0x20;
  iVar6 = pcVar8->pic_width;
  lVar26 = (long)iVar6;
  ppVar30 = pcVar7->uv;
  iVar13 = ((int)uVar2 / 2) * 2 + 0x40;
  lVar29 = (long)iVar25;
  iVar25 = uVar27 * 4 + -4;
  if (pcVar8->pic_height_in_lcu + -1 <= lcu_y) {
    iVar25 = uVar27 * 4;
  }
  local_c0 = pcVar7->y + (int)((iVar16 + (uint)(uVar27 == 0) * 4 + -4) * iVar3);
  iVar23 = uVar20 + iVar25;
  pbVar32 = local_c0;
  iVar17 = 0;
  iVar14 = 0;
  if (0 < iVar23) {
    iVar17 = iVar23;
    iVar14 = iVar23;
  }
  while (iVar17 != 0) {
    *(uint *)(pbVar32 + -4) = (uint)*pbVar32 * 0x1010101;
    *(uint *)(pbVar32 + lVar26) = (uint)pbVar32[lVar26 + -1] * 0x1010101;
    pbVar32 = pbVar32 + iVar3;
    iVar17 = iVar17 + -1;
  }
  puVar24 = (ushort *)(ppVar30 + (int)(((iVar16 >> 1) + (uint)(uVar27 == 0) * 4 + -4) * iVar4));
  iVar25 = iVar25 + ((int)uVar20 >> 1);
  puVar22 = puVar24;
  iVar16 = 0;
  iVar17 = 0;
  if (0 < iVar25) {
    iVar16 = iVar25;
    iVar17 = iVar25;
  }
  while (iVar16 != 0) {
    *(ulong *)(puVar22 + -4) = (ulong)*puVar22 * 0x1000100010001;
    *(ulong *)((long)puVar22 + lVar26) =
         (ulong)*(ushort *)((long)puVar22 + lVar26 + -2) * 0x1000100010001;
    puVar22 = (ushort *)((long)puVar22 + (long)iVar4);
    iVar16 = iVar16 + -1;
  }
  piVar1 = (pcVar10->alf_param).filterCoeff_chroma;
  piVar15 = (pcVar10->alf_param).filterCoeff_chroma + 1;
  iVar19 = 0;
  iVar16 = 3;
  iVar21 = 6;
  do {
    if (iVar6 <= iVar19) {
      return;
    }
    uVar20 = iVar6 - iVar19;
    if ((int)uVar2 < iVar6 - iVar19) {
      uVar20 = uVar2;
    }
    pauVar11 = core->alf_enable_map;
    iVar18 = 3;
    if (pauVar11[lVar29][0] != '\0') {
      iVar18 = (pcVar10->alf_param).varIndTab[pcVar8->alf_idx_map[lVar29]];
      ppVar30 = local_b8 + -iVar16;
      pbVar32 = local_c0 + -iVar16;
      iVar28 = iVar14;
      while (bVar35 = iVar28 != 0, iVar28 = iVar28 + -1, bVar35) {
        memcpy(ppVar30,pbVar32,(long)(int)(iVar16 + uVar20 + 3));
        ppVar30 = ppVar30 + lVar31 + 0x20;
        pbVar32 = pbVar32 + iVar3;
      }
      paiVar33 = (pcVar10->alf_param).filterCoeff_luma + iVar18;
      iVar16 = (int)(lVar31 + 0x20);
      (*uavs3d_funs_handle.alf[0])(local_c0,iVar3,local_b8,iVar16,uVar20,iVar23,*paiVar33,iVar5);
      (*uavs3d_funs_handle.alf_fix[0])(local_c0,iVar3,local_b8,iVar16,uVar20,iVar23,*paiVar33,iVar5)
      ;
      iVar18 = -3;
    }
    iVar16 = (int)uVar20 >> 1;
    if ((pauVar11[lVar29][1] == '\0') && (iVar28 = 6, pauVar11[lVar29][2] == '\0')) {
LAB_0010efde:
      if (pauVar11[lVar29][2] != '\0') {
        (*uavs3d_funs_handle.alf[2])
                  ((pel *)((long)puVar24 + 1),iVar4,ppVar34 + 1,iVar13,iVar16,iVar25,piVar15,iVar5);
        (*uavs3d_funs_handle.alf_fix[1])
                  ((pel *)((long)puVar24 + 1),iVar4,ppVar34 + 1,iVar13,iVar16,iVar25,piVar15,iVar5);
      }
    }
    else {
      ppVar30 = ppVar34 + -iVar21;
      __src = (void *)((long)-iVar21 + (long)puVar24);
      iVar28 = iVar17;
      while (bVar35 = iVar28 != 0, iVar28 = iVar28 + -1, bVar35) {
        memcpy(ppVar30,__src,(long)(int)(iVar21 + (uVar20 & 0xfffffffe) + 6));
        ppVar30 = ppVar30 + iVar13;
        __src = (void *)((long)__src + (long)iVar4);
      }
      iVar28 = -6;
      if (pauVar11[lVar29][1] == '\0') goto LAB_0010efde;
      if (pauVar11[lVar29][2] == '\0') {
        (*uavs3d_funs_handle.alf[2])((pel *)puVar24,iVar4,ppVar34,iVar13,iVar16,iVar25,piVar1,iVar5)
        ;
        (*uavs3d_funs_handle.alf_fix[1])
                  ((pel *)puVar24,iVar4,ppVar34,iVar13,iVar16,iVar25,piVar1,iVar5);
        iVar28 = -6;
        goto LAB_0010efde;
      }
      (*uavs3d_funs_handle.alf[1])((pel *)puVar24,iVar4,ppVar34,iVar13,iVar16,iVar25,piVar1,iVar5);
      (*uavs3d_funs_handle.alf_fix[1])
                ((pel *)puVar24,iVar4,ppVar34,iVar13,iVar16,iVar25,piVar1,iVar5);
      (*uavs3d_funs_handle.alf_fix[1])
                ((pel *)((long)puVar24 + 1),iVar4,ppVar34 + 1,iVar13,iVar16,iVar25,piVar15,iVar5);
      iVar28 = -6;
    }
    iVar19 = iVar19 + uVar2;
    lVar29 = lVar29 + 1;
    local_c0 = local_c0 + lVar31;
    puVar24 = (ushort *)((long)puVar24 + lVar31);
    local_b8 = local_b8 + lVar31;
    ppVar34 = ppVar34 + lVar31;
    iVar16 = iVar18;
    iVar21 = iVar28;
  } while( true );
}

Assistant:

void com_alf_lcu_row(com_core_t *core, int lcu_y)
{
    com_pic_t* pic = core->pic;
    com_seqh_t *seqhdr = core->seqhdr;
    com_map_t *map = &core->map;
    com_alf_pic_param_t *alfParam = &core->pichdr->alf_param;
    int lcu_size = seqhdr->max_cuwh;
    int pix_x, pix_y = lcu_y * lcu_size;
    int bit_depth = seqhdr->bit_depth_internal;
    int img_width = seqhdr->pic_width;
    int img_height = seqhdr->pic_height;
    int i_dstl = pic->stride_luma;
    int i_dstc = pic->stride_chroma;
    pel *dstl  = pic->y;
    pel *dstc  = pic->uv;
    int lcu_idx = lcu_y * seqhdr->pic_width_in_lcu;
    int lcu_h = COM_MIN(lcu_size, img_height - pix_y);
    int lcu_h_c = lcu_h >> 1;
    int isAboveAvail = (lcu_y > 0);
    int isBelowAvail = (lcu_y < seqhdr->pic_height_in_lcu - 1);
    int y_offset = 0, height_offset = 0;
    int pix_y_c = pix_y >> 1;
    int i_bufl = lcu_size + ALIGN_BASIC;
    int i_bufc = (lcu_size / 2 + ALIGN_BASIC) * 2;
    pel *bufl = core->alf_src_buf[0] + ALIGN_BASIC;
    pel *bufc = core->alf_src_buf[1] + ALIGN_BASIC;
    int adj_l = 3, adj_c = 6;

    if (!seqhdr->cross_patch_loop_filter && isAboveAvail) {
        s8* map_patch = map->map_patch + lcu_y * seqhdr->pic_width_in_lcu;
        if (isAboveAvail && map_patch[0] != map_patch[-seqhdr->pic_width_in_lcu]) {
            isAboveAvail = FALSE;
        }
    }
    if (isAboveAvail) {
        y_offset -= 4;
        height_offset += 4;
    }
    if (isBelowAvail) {
        height_offset -= 4;
    }
    dstl += (pix_y + y_offset) * i_dstl;
    dstc += (pix_y_c + y_offset) * i_dstc;
    
    lcu_h   += height_offset;
    lcu_h_c += height_offset;

    // padding
    pel *tmpl = dstl, *tmpr = dstl + img_width - 1;
    for (int i = 0; i < lcu_h; i++) {
#if (BIT_DEPTH == 8)
        M32(tmpl - 4) = tmpl[0] * 0x01010101;
        M32(tmpr + 1) = tmpr[0] * 0x01010101;
#else
        M64(tmpl - 4) = tmpl[0] * 0x0001000100010001;
        M64(tmpr + 1) = tmpr[0] * 0x0001000100010001;
#endif
        tmpl += i_dstl;
        tmpr += i_dstl;
    }

    tmpl = dstc, tmpr = dstc + img_width - 2;
    for (int i = 0; i < lcu_h_c; i++) {
#if (BIT_DEPTH == 8)
        M64(tmpl - 8) = M16(tmpl) * 0x0001000100010001;
        M64(tmpr + 2) = M16(tmpr) * 0x0001000100010001;
#else
        M64(tmpl - 8) = M64(tmpl - 4) = M32(tmpl) * 0x0000000100000001;
        M64(tmpr + 2) = M64(tmpr + 6) = M32(tmpr) * 0x0000000100000001;
#endif
        tmpl += i_dstc;
        tmpr += i_dstc;
    }

    for (pix_x = 0; pix_x < img_width; pix_x += lcu_size, lcu_idx++, dstl += lcu_size, dstc += lcu_size, bufl += lcu_size, bufc += lcu_size) {
        int lcu_w = COM_MIN(lcu_size, img_width  - pix_x);
        int lcu_w_c = lcu_w >> 1;
        u8 *enable_flag = core->alf_enable_map[lcu_idx];

        if (enable_flag[Y_C]) {
            int *coef = alfParam->filterCoeff_luma[alfParam->varIndTab[seqhdr->alf_idx_map[lcu_idx]]];
            pel *tmp_d = bufl - adj_l;
            pel *tmp_s = dstl - adj_l;
            int cpy_size = (lcu_w + 3 + adj_l) * sizeof(pel);
 
            for (int i = 0; i < lcu_h; i++) {
                memcpy(tmp_d, tmp_s, cpy_size);
                tmp_d += i_bufl;
                tmp_s += i_dstl;
            }
            uavs3d_funs_handle.alf    [Y_C](dstl, i_dstl, bufl, i_bufl, lcu_w, lcu_h, coef, bit_depth);
            uavs3d_funs_handle.alf_fix[Y_C](dstl, i_dstl, bufl, i_bufl, lcu_w, lcu_h, coef, bit_depth);
            adj_l = -3;
        } else {
            adj_l = 3;
        }
        if (enable_flag[U_C] || enable_flag[V_C]) {
            pel *tmp_d = bufc - adj_c;
            pel *tmp_s = dstc - adj_c;
            int cpy_size = (lcu_w_c * 2 + 6 + adj_c) * sizeof(pel);

            for (int i = 0; i < lcu_h_c; i++) {
                memcpy(tmp_d, tmp_s, cpy_size);
                tmp_d += i_bufc;
                tmp_s += i_dstc;
            }
            adj_c = -6;
        } else {
            adj_c = 6;
        }
        if (enable_flag[U_C] && enable_flag[V_C]) {
            uavs3d_funs_handle.alf    [UV_C](dstc,     i_dstc, bufc,     i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma    , bit_depth);
            uavs3d_funs_handle.alf_fix[UV_C](dstc,     i_dstc, bufc,     i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma    , bit_depth);
            uavs3d_funs_handle.alf_fix[UV_C](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
        } else {
            if (enable_flag[U_C]) {
                uavs3d_funs_handle.alf    [ 2  ](dstc, i_dstc, bufc, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma, bit_depth);
                uavs3d_funs_handle.alf_fix[UV_C](dstc, i_dstc, bufc, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma, bit_depth);
            }
            if (enable_flag[V_C]) {
                uavs3d_funs_handle.alf    [ 2  ](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
                uavs3d_funs_handle.alf_fix[UV_C](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
            }
        }
    }
}